

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:515:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:515:17)>
             *this)

{
  AutoCloseFd *pAVar1;
  int (*paiVar2) [2];
  int iVar3;
  ssize_t sVar4;
  char c;
  Fault f_1;
  AutoCloseFd clientFd;
  socklen_t caddrLen;
  sockaddr_in caddr;
  
  caddrLen = 0x10;
  pAVar1 = (this->f).serverFd;
  do {
    clientFd.fd = accept(pAVar1->fd,(sockaddr *)&caddr,&caddrLen);
    if (-1 < clientFd.fd) goto LAB_0020ff61;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    _::Debug::Fault::Fault
              ((Fault *)&clientFd,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x209,iVar3,
               "tmpFd = accept(serverFd, reinterpret_cast<sockaddr*>(&caddr), &caddrLen)","");
    _::Debug::Fault::fatal((Fault *)&clientFd);
  }
LAB_0020ff61:
  UnwindDetector::UnwindDetector(&clientFd.unwindDetector);
  anon_unknown_0::delay();
  c = 'i';
  do {
    sVar4 = ::send(clientFd.fd,&c,1,0);
    if (-1 < sVar4) goto LAB_0020ffaa;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    _::Debug::Fault::Fault
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x20f,iVar3,"send(clientFd, &c, 1, 0)","");
    _::Debug::Fault::fatal(&f_1);
  }
LAB_0020ffaa:
  c = 'o';
  do {
    sVar4 = ::send(clientFd.fd,&c,1,1);
    if (-1 < sVar4) goto LAB_0021001e;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    if (iVar3 != 0x16) {
      _::Debug::Fault::Fault
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x217,iVar3,"send(..., MSG_OOB)","");
      _::Debug::Fault::fatal(&f_1);
    }
    paiVar2 = (this->f).failpipe;
    do {
      sVar4 = ::write((*paiVar2)[1],&c,1);
      if (-1 < sVar4) goto LAB_0021001e;
      iVar3 = _::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      _::Debug::Fault::Fault
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x214,iVar3,"write(failpipe[1], &c, 1)","");
      _::Debug::Fault::fatal(&f_1);
    }
  }
LAB_0021001e:
  do {
    sVar4 = recv(clientFd.fd,&c,1,0);
    if (-1 < sVar4) goto LAB_0021004d;
    iVar3 = _::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    _::Debug::Fault::Fault
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x21a,iVar3,"recv(clientFd, &c, 1, 0)","");
    _::Debug::Fault::fatal(&f_1);
  }
LAB_0021004d:
  if ((c != 'q') && (_::Debug::minSeverity < 3)) {
    f_1.exception._0_1_ = 0x71;
    _::Debug::log<char_const(&)[30],char,char&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x21b,ERROR,"\"failed: expected \" \"(\'q\') == (c)\", \'q\', c",
               (char (*) [30])"failed: expected (\'q\') == (c)",(char *)&f_1,&c);
  }
  AutoCloseFd::~AutoCloseFd(&clientFd);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }